

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O0

void __thiscall
optimization::common_expr_del::BlockNodes::add_var(BlockNodes *this,VarId *var,NodeId nodeId)

{
  bool bVar1;
  mapped_type *pmVar2;
  element_type *peVar3;
  uint in_EDX;
  long in_RDI;
  VarId *in_stack_ffffffffffffff98;
  Node *in_stack_ffffffffffffffa0;
  key_type *in_stack_ffffffffffffffd8;
  map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
  *in_stack_ffffffffffffffe0;
  
  pmVar2 = std::
           map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
           ::operator[](in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pmVar2->id = in_EDX;
  mir::inst::VarId::VarId((VarId *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  bVar1 = in_live_out((BlockNodes *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (bVar1) {
    std::
    vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
    ::operator[]((vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                  *)(in_RDI + 8),(ulong)in_EDX);
    peVar3 = std::
             __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x16a230);
    mir::inst::VarId::VarId((VarId *)peVar3,in_stack_ffffffffffffff98);
    Node::add_live_var(peVar3,in_stack_ffffffffffffff98);
  }
  else {
    std::
    vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
    ::operator[]((vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                  *)(in_RDI + 8),(ulong)in_EDX);
    peVar3 = std::
             __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x16a271);
    mir::inst::VarId::VarId((VarId *)in_stack_ffffffffffffffa0,(VarId *)peVar3);
    Node::add_local_var(in_stack_ffffffffffffffa0,(VarId *)peVar3);
  }
  return;
}

Assistant:

void add_var(mir::inst::VarId var, NodeId nodeId) {
    var_map[var] = nodeId;
    if (in_live_out(var)) {
      nodes[nodeId.id]->add_live_var(var);
    } else {
      nodes[nodeId.id]->add_local_var(var);
    }
  }